

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O0

PatternType __thiscall
QMimeGlobPattern::detectPatternType(QMimeGlobPattern *this,QStringView pattern)

{
  bool bVar1;
  QStringView *this_00;
  QStringView *this_01;
  qsizetype qVar2;
  long in_FS_OFFSET;
  byte bVar3;
  undefined1 uVar4;
  bool hasQuestionMark;
  bool hasSquareBracket;
  qsizetype starCount;
  qsizetype patternLength;
  undefined4 in_stack_ffffffffffffff88;
  CaseSensitivity in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  PatternType local_4c;
  QChar c;
  undefined1 in_stack_ffffffffffffffb8 [16];
  QChar c_00;
  undefined1 in_stack_ffffffffffffffc8 [16];
  QChar local_26;
  char16_t local_24;
  QChar local_22;
  char16_t local_20;
  QChar local_1e;
  QChar local_1c;
  QChar local_1a;
  QStringView local_18;
  long local_8;
  
  c_00.ucs = in_stack_ffffffffffffffc8._6_2_;
  c.ucs = in_stack_ffffffffffffffb8._6_2_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QStringView *)QStringView::size(&local_18);
  if (this_00 == (QStringView *)0x0) {
    local_4c = OtherPattern;
    goto LAB_008ed6cf;
  }
  QChar::QChar<char16_t,_true>(&local_1a,L'*');
  this_01 = (QStringView *)
            QStringView::count((QStringView *)
                               CONCAT17(in_stack_ffffffffffffff97,
                                        CONCAT16(in_stack_ffffffffffffff96,
                                                 CONCAT24(in_stack_ffffffffffffff94,
                                                          in_stack_ffffffffffffff90))),c,
                               in_stack_ffffffffffffff8c);
  QChar::QChar<char16_t,_true>(&local_1c,L'[');
  qVar2 = QStringView::indexOf
                    (this_00,c_00,(qsizetype)this_01,
                     CONCAT13(in_stack_ffffffffffffff97,
                              CONCAT12(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94)));
  bVar3 = qVar2 != -1;
  QChar::QChar<char16_t,_true>(&local_1e,L'?');
  qVar2 = QStringView::indexOf
                    (this_00,c_00,(qsizetype)this_01,
                     CONCAT13(bVar3,CONCAT12(in_stack_ffffffffffffff96,in_stack_ffffffffffffff94)));
  uVar4 = qVar2 != -1;
  if (((bVar3 & 1) == 0) && (!(bool)uVar4)) {
    if (this_01 == (QStringView *)0x1) {
      local_20 = (char16_t)
                 QStringView::at((QStringView *)0x1,
                                 CONCAT17(bVar3,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff94,
                                                                        in_stack_ffffffffffffff90)))
                                );
      QChar::QChar<char16_t,_true>(&local_22,L'*');
      bVar1 = ::operator==((QChar *)CONCAT17(bVar3,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff94
                                                                           ,
                                                  in_stack_ffffffffffffff90))),
                           (QChar *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (bVar1) {
        local_4c = SuffixPattern;
        goto LAB_008ed6cf;
      }
      local_24 = (char16_t)
                 QStringView::at(this_01,CONCAT17(bVar3,CONCAT16(uVar4,CONCAT24(
                                                  in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90))));
      QChar::QChar<char16_t,_true>(&local_26,L'*');
      bVar1 = ::operator==((QChar *)CONCAT17(bVar3,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff94
                                                                           ,
                                                  in_stack_ffffffffffffff90))),
                           (QChar *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (bVar1) {
        local_4c = PrefixPattern;
        goto LAB_008ed6cf;
      }
    }
    else if (this_01 == (QStringView *)0x0) {
      local_4c = LiteralPattern;
      goto LAB_008ed6cf;
    }
  }
  Qt::Literals::StringLiterals::operator____L1
            ((char *)this_01,
             CONCAT17(bVar3,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff94,
                                                    in_stack_ffffffffffffff90))));
  bVar1 = ::operator==((QStringView *)
                       CONCAT17(bVar3,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff94,
                                                              in_stack_ffffffffffffff90))),
                       (QLatin1StringView *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (bVar1) {
    local_4c = VdrPattern;
  }
  else {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)this_01,
               CONCAT17(bVar3,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff94,
                                                      in_stack_ffffffffffffff90))));
    bVar1 = ::operator==((QStringView *)
                         CONCAT17(bVar3,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff94,
                                                                in_stack_ffffffffffffff90))),
                         (QLatin1StringView *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (bVar1) {
      local_4c = AnimPattern;
    }
    else {
      local_4c = OtherPattern;
    }
  }
LAB_008ed6cf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

QMimeGlobPattern::PatternType QMimeGlobPattern::detectPatternType(QStringView pattern) const
{
    const qsizetype patternLength = pattern.size();
    if (!patternLength)
        return OtherPattern;

    const qsizetype starCount = pattern.count(u'*');
    const bool hasSquareBracket = pattern.indexOf(u'[') != -1;
    const bool hasQuestionMark = pattern.indexOf(u'?') != -1;

    if (!hasSquareBracket && !hasQuestionMark) {
        if (starCount == 1) {
            // Patterns like "*~", "*.extension"
            if (pattern.at(0) == u'*')
                return SuffixPattern;
            // Patterns like "README*" (well this is currently the only one like that...)
            if (pattern.at(patternLength - 1) == u'*')
                return PrefixPattern;
        } else if (starCount == 0) {
            // Names without any wildcards like "README"
            return LiteralPattern;
        }
    }

    if (pattern == "[0-9][0-9][0-9].vdr"_L1)
        return VdrPattern;

    if (pattern == "*.anim[1-9j]"_L1)
        return AnimPattern;

    return OtherPattern;
}